

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O0

QStringList * QStandardPaths::standardLocations(StandardLocation type)

{
  long lVar1;
  QLatin1StringView str;
  QLatin1StringView str_00;
  qsizetype qVar2;
  long lVar3;
  char *str_01;
  undefined4 in_ESI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  int i_3;
  int i_2;
  int i_1;
  int i;
  QStringList *dirs;
  QString localDir;
  QStringBuilder<QString,_QLatin1String> *in_stack_fffffffffffffe38;
  QLatin1String *in_stack_fffffffffffffe40;
  QString *in_stack_fffffffffffffe48;
  qsizetype in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  QString *in_stack_fffffffffffffe60;
  int local_158;
  int local_154;
  int local_13c;
  int local_138;
  StandardLocation in_stack_ffffffffffffff64;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x7ddbfd);
  switch(in_ESI) {
  case 2:
    QDir::homePath();
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
    ::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe38);
    QList<QString>::operator+=
              ((QList<QString> *)in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->a);
    QString::~QString((QString *)0x7ddf2a);
    QStringBuilder<QString,_QLatin1String>::~QStringBuilder
              ((QStringBuilder<QString,_QLatin1String> *)0x7ddf37);
    QString::~QString((QString *)0x7ddf44);
    xdgDataDirs();
    QList<QString>::operator+=
              ((QList<QString> *)in_stack_fffffffffffffe40,
               (QList<QString> *)in_stack_fffffffffffffe38);
    QList<QString>::~QList((QList<QString> *)0x7ddf74);
    local_158 = 1;
    while( true ) {
      str_01 = (char *)(long)local_158;
      qVar2 = QList<QString>::size(in_RDI);
      if (qVar2 <= (long)str_01) break;
      in_stack_fffffffffffffe40 =
           (QLatin1String *)
           QList<QString>::operator[]
                     ((QList<QString> *)in_stack_fffffffffffffe40,
                      (qsizetype)in_stack_fffffffffffffe38);
      Qt::Literals::StringLiterals::operator____L1(str_01,(size_t)in_stack_fffffffffffffe40);
      str_00.m_data = in_stack_fffffffffffffe58;
      str_00.m_size = in_stack_fffffffffffffe50;
      QString::append(&in_stack_fffffffffffffe38->a,str_00);
      local_158 = local_158 + 1;
    }
    break;
  case 3:
    xdgDataDirs();
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffffe40,
               (QList<QString> *)in_stack_fffffffffffffe38);
    QList<QString>::~QList((QList<QString> *)0x7ddd7a);
    for (local_13c = 0; qVar2 = QList<QString>::size(in_RDI), local_13c < qVar2;
        local_13c = local_13c + 1) {
      QList<QString>::operator[]
                ((QList<QString> *)in_stack_fffffffffffffe40,(qsizetype)in_stack_fffffffffffffe38);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
      str.m_data = in_stack_fffffffffffffe58;
      str.m_size = in_stack_fffffffffffffe50;
      QString::append(&in_stack_fffffffffffffe38->a,str);
    }
    break;
  default:
    break;
  case 9:
  case 0x11:
    xdgDataDirs();
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffffe40,
               (QList<QString> *)in_stack_fffffffffffffe38);
    QList<QString>::~QList((QList<QString> *)0x7dde44);
    local_154 = 0;
    while( true ) {
      lVar3 = (long)local_154;
      qVar2 = QList<QString>::size(in_RDI);
      if (qVar2 <= lVar3) break;
      QList<QString>::operator[]
                ((QList<QString> *)in_stack_fffffffffffffe40,(qsizetype)in_stack_fffffffffffffe38);
      appendOrganizationAndApp(in_stack_fffffffffffffe60);
      local_154 = local_154 + 1;
    }
    break;
  case 0xb:
    xdgDataDirs();
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffffe40,
               (QList<QString> *)in_stack_fffffffffffffe38);
    QList<QString>::~QList((QList<QString> *)0x7ddd47);
    break;
  case 0xd:
  case 0x10:
    xdgConfigDirs();
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffffe40,
               (QList<QString> *)in_stack_fffffffffffffe38);
    QList<QString>::~QList((QList<QString> *)0x7ddc5b);
    break;
  case 0x12:
    xdgConfigDirs();
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffffe40,
               (QList<QString> *)in_stack_fffffffffffffe38);
    QList<QString>::~QList((QList<QString> *)0x7ddcab);
    for (local_138 = 0; qVar2 = QList<QString>::size(in_RDI), local_138 < qVar2;
        local_138 = local_138 + 1) {
      QList<QString>::operator[]
                ((QList<QString> *)in_stack_fffffffffffffe40,(qsizetype)in_stack_fffffffffffffe38);
      appendOrganizationAndApp(in_stack_fffffffffffffe60);
    }
  }
  writableLocation(in_stack_ffffffffffffff64);
  QList<QString>::prepend((QList<QString> *)in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->a)
  ;
  QString::~QString((QString *)0x7de0fd);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList QStandardPaths::standardLocations(StandardLocation type)
{
    QStringList dirs;
    switch (type) {
    case ConfigLocation:
    case GenericConfigLocation:
        dirs = xdgConfigDirs();
        break;
    case AppConfigLocation:
        dirs = xdgConfigDirs();
        for (int i = 0; i < dirs.size(); ++i)
            appendOrganizationAndApp(dirs[i]);
        break;
    case GenericDataLocation:
        dirs = xdgDataDirs();
        break;
    case ApplicationsLocation:
        dirs = xdgDataDirs();
        for (int i = 0; i < dirs.size(); ++i)
            dirs[i].append("/applications"_L1);
        break;
    case AppDataLocation:
    case AppLocalDataLocation:
        dirs = xdgDataDirs();
        for (int i = 0; i < dirs.size(); ++i)
            appendOrganizationAndApp(dirs[i]);
        break;
    case FontsLocation:
        dirs += QDir::homePath() + "/.fonts"_L1;
        dirs += xdgDataDirs();
        for (int i = 1; i < dirs.size(); ++i)
            dirs[i].append("/fonts"_L1);
        break;
    default:
        break;
    }
    const QString localDir = writableLocation(type);
    dirs.prepend(localDir);
    return dirs;
}